

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyBumpObject(TidyDocImpl *doc,Node *html)

{
  TidyTagId TVar1;
  Node *node;
  Bool BVar2;
  Node *pNVar3;
  Node **ppNVar4;
  Node *pNVar5;
  Node *element;
  
  if (html != (Node *)0x0) {
    pNVar3 = (Node *)0x0;
    element = (Node *)0x0;
    ppNVar4 = &html->content;
    while (pNVar5 = *ppNVar4, pNVar5 != (Node *)0x0) {
      if (pNVar5->tag != (Dict *)0x0) {
        TVar1 = pNVar5->tag->id;
        if (TVar1 == TidyTag_HEAD) {
          pNVar3 = pNVar5;
        }
        if (TVar1 == TidyTag_BODY) {
          element = pNVar5;
        }
      }
      ppNVar4 = &pNVar5->next;
    }
    if ((pNVar3 != (Node *)0x0) && (element != (Node *)0x0)) {
      pNVar3 = pNVar3->content;
LAB_0014c59a:
      pNVar5 = pNVar3;
      if (pNVar5 != (Node *)0x0) {
        pNVar3 = pNVar5->next;
        if ((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TidyTag_OBJECT)) {
          ppNVar4 = &pNVar5->content;
          do {
            node = *ppNVar4;
            if (node == (Node *)0x0) goto LAB_0014c59a;
            BVar2 = prvTidynodeIsText(node);
          } while ((((BVar2 == no) || (BVar2 = prvTidyIsBlank(doc->lexer,pNVar5), BVar2 != no)) &&
                   (node->tag != (Dict *)0x0)) &&
                  (ppNVar4 = &node->next, node->tag->id == TidyTag_PARAM));
          prvTidyRemoveNode(pNVar5);
          prvTidyInsertNodeAtStart(element,pNVar5);
        }
        goto LAB_0014c59a;
      }
    }
  }
  return;
}

Assistant:

void TY_(BumpObject)( TidyDocImpl* doc, Node *html )
{
    Node *node, *next, *head = NULL, *body = NULL;

    if (!html)
        return;

    for ( node = html->content; node != NULL; node = node->next )
    {
        if ( nodeIsHEAD(node) )
            head = node;

        if ( nodeIsBODY(node) )
            body = node;
    }

    if ( head != NULL && body != NULL )
    {
        for (node = head->content; node != NULL; node = next)
        {
            next = node->next;

            if ( nodeIsOBJECT(node) )
            {
                Node *child;
                Bool bump = no;

                for (child = node->content; child != NULL; child = child->next)
                {
                    /* bump to body unless content is param */
                    if ( (TY_(nodeIsText)(child) && !TY_(IsBlank)(doc->lexer, node))
                         || !nodeIsPARAM(child) )
                    {
                            bump = yes;
                            break;
                    }
                }

                if ( bump )
                {
                    TY_(RemoveNode)( node );
                    TY_(InsertNodeAtStart)( body, node );
                }
            }
        }
    }
}